

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O1

void __thiscall
cmFindLibraryHelper::DebugLibraryFailed(cmFindLibraryHelper *this,string *name,string *path)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string regexName;
  string local_90;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  size_type local_40;
  pointer local_38;
  size_type local_30;
  pointer local_28;
  
  if (this->DebugMode == true) {
    local_50._M_str = (this->PrefixRegexStr)._M_dataplus._M_p;
    local_50._M_len = (this->PrefixRegexStr)._M_string_length;
    local_38 = (name->_M_dataplus)._M_p;
    local_40 = name->_M_string_length;
    local_28 = (this->SuffixRegexStr)._M_dataplus._M_p;
    local_30 = (this->SuffixRegexStr)._M_string_length;
    views._M_len = 3;
    views._M_array = &local_50;
    cmCatViews_abi_cxx11_(&local_70,views);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
    cmFindBaseDebugState::FailedAt(&this->DebugSearches,path,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void DebugLibraryFailed(std::string const& name, std::string const& path)
  {
    if (this->DebugMode) {
      auto regexName =
        cmStrCat(this->PrefixRegexStr, name, this->SuffixRegexStr);
      this->DebugSearches.FailedAt(path, regexName);
    }
  }